

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  RTCFilterFunctionN p_Var2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  Intersectors *pIVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined4 uVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  Geometry *pGVar12;
  long lVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  Geometry *pGVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2680 [16];
  undefined8 local_2670;
  undefined8 uStack_2668;
  long local_2658;
  Intersectors *local_2650;
  ulong local_2648;
  ulong local_2640;
  ulong local_2638;
  undefined1 (*local_2630) [16];
  Scene *local_2628;
  undefined8 *local_2620;
  ulong local_2618;
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  RTCHitN local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar20 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar81 = ZEXT3264(CONCAT428(fVar42,CONCAT424(fVar42,CONCAT420(fVar42,CONCAT416(fVar42,CONCAT412(
                                                  fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42)))))
                                               )));
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar45;
  local_23c0._0_4_ = fVar45;
  local_23c0._8_4_ = fVar45;
  local_23c0._12_4_ = fVar45;
  local_23c0._16_4_ = fVar45;
  local_23c0._20_4_ = fVar45;
  local_23c0._24_4_ = fVar45;
  local_23c0._28_4_ = fVar45;
  auVar52 = ZEXT3264(local_23c0);
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar46;
  local_23e0._0_4_ = fVar46;
  local_23e0._8_4_ = fVar46;
  local_23e0._12_4_ = fVar46;
  local_23e0._16_4_ = fVar46;
  local_23e0._20_4_ = fVar46;
  local_23e0._24_4_ = fVar46;
  local_23e0._28_4_ = fVar46;
  auVar55 = ZEXT3264(local_23e0);
  fVar42 = fVar42 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar46 = fVar46 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = uVar22 ^ 0x20;
  uVar25 = uVar14 ^ 0x20;
  iVar9 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT3264(CONCAT428(iVar9,CONCAT424(iVar9,CONCAT420(iVar9,CONCAT416(iVar9,CONCAT412(iVar9
                                                  ,CONCAT48(iVar9,CONCAT44(iVar9,iVar9))))))));
  local_2618 = uVar18 ^ 0x20;
  local_2400._0_8_ = CONCAT44(fVar42,fVar42) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar42;
  local_2400._12_4_ = -fVar42;
  local_2400._16_4_ = -fVar42;
  local_2400._20_4_ = -fVar42;
  local_2400._24_4_ = -fVar42;
  local_2400._28_4_ = -fVar42;
  auVar58 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar45;
  local_2420._12_4_ = -fVar45;
  local_2420._16_4_ = -fVar45;
  local_2420._20_4_ = -fVar45;
  local_2420._24_4_ = -fVar45;
  local_2420._28_4_ = -fVar45;
  auVar63 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar46,fVar46) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar46;
  local_2440._12_4_ = -fVar46;
  local_2440._16_4_ = -fVar46;
  local_2440._20_4_ = -fVar46;
  local_2440._24_4_ = -fVar46;
  local_2440._28_4_ = -fVar46;
  auVar69 = ZEXT3264(local_2440);
  iVar9 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar9;
  local_2460._0_4_ = iVar9;
  local_2460._8_4_ = iVar9;
  local_2460._12_4_ = iVar9;
  local_2460._16_4_ = iVar9;
  local_2460._20_4_ = iVar9;
  local_2460._24_4_ = iVar9;
  local_2460._28_4_ = iVar9;
  auVar72 = ZEXT3264(local_2460);
  local_2620 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  do {
    do {
      do {
        if (pauVar20 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar19 = pauVar20 + -1;
        pauVar20 = pauVar20 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar19 + 8));
      uVar27 = *(ulong *)*pauVar20;
      do {
        auVar68 = auVar69._0_32_;
        auVar62 = auVar63._0_32_;
        auVar57 = auVar58._0_32_;
        auVar54 = auVar55._0_32_;
        auVar51 = auVar52._0_32_;
        if ((uVar27 & 8) == 0) {
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar41._4_4_ = uVar10;
          auVar41._0_4_ = uVar10;
          auVar41._8_4_ = uVar10;
          auVar41._12_4_ = uVar10;
          auVar41._16_4_ = uVar10;
          auVar41._20_4_ = uVar10;
          auVar41._24_4_ = uVar10;
          auVar41._28_4_ = uVar10;
          uVar11 = uVar27 & 0xfffffffffffffff0;
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar22),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + uVar22));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar14),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + uVar14));
          auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar81._0_32_,auVar57);
          auVar39 = vfmadd213ps_fma(ZEXT1632(auVar39),auVar51,auVar62);
          auVar3 = vpmaxsd_avx2(ZEXT1632(auVar38),ZEXT1632(auVar39));
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar18),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + uVar18));
          auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar54,auVar68);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar38),auVar72._0_32_);
          local_25e0 = vpmaxsd_avx2(auVar3,auVar4);
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar23),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + uVar23));
          auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar81._0_32_,auVar57);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar25),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + uVar25));
          auVar39 = vfmadd213ps_fma(ZEXT1632(auVar39),auVar51,auVar62);
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_2618),auVar41,
                                    *(undefined1 (*) [32])(uVar11 + 0x40 + local_2618));
          auVar3 = vpminsd_avx2(ZEXT1632(auVar38),ZEXT1632(auVar39));
          auVar38 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar54,auVar68);
          auVar4 = vpminsd_avx2(ZEXT1632(auVar38),auVar31._0_32_);
          auVar3 = vpminsd_avx2(auVar3,auVar4);
          auVar3 = vcmpps_avx(local_25e0,auVar3,2);
          if (((uint)uVar27 & 7) == 6) {
            auVar4 = vcmpps_avx(*(undefined1 (*) [32])(uVar11 + 0x1c0),auVar41,2);
            auVar41 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar11 + 0x1e0),1);
            auVar4 = vandps_avx(auVar4,auVar41);
            auVar3 = vandps_avx(auVar4,auVar3);
            auVar38 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
          }
          else {
            auVar38 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
          }
          auVar38 = vpsllw_avx(auVar38,0xf);
          auVar38 = vpacksswb_avx(auVar38,auVar38);
          This = (Intersectors *)
                 (ulong)(byte)(SUB161(auVar38 >> 7,0) & 1 | (SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar38 >> 0x37,0) & 1) << 6 | SUB161(auVar38 >> 0x3f,0) << 7
                              );
        }
        if ((uVar27 & 8) == 0) {
          if (This == (Intersectors *)0x0) {
            iVar9 = 4;
          }
          else {
            uVar11 = uVar27 & 0xfffffffffffffff0;
            lVar13 = 0;
            for (pIVar5 = This; ((ulong)pIVar5 & 1) == 0;
                pIVar5 = (Intersectors *)((ulong)pIVar5 >> 1 | 0x8000000000000000)) {
              lVar13 = lVar13 + 1;
            }
            iVar9 = 0;
            uVar16 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            uVar27 = *(ulong *)(uVar11 + lVar13 * 8);
            if (uVar16 != 0) {
              uVar59 = *(uint *)(local_25e0 + lVar13 * 4);
              lVar13 = 0;
              for (uVar6 = uVar16; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              uVar16 = uVar16 - 1 & uVar16;
              uVar6 = *(ulong *)(uVar11 + lVar13 * 8);
              uVar64 = *(uint *)(local_25e0 + lVar13 * 4);
              if (uVar16 == 0) {
                if (uVar59 < uVar64) {
                  *(ulong *)*pauVar20 = uVar6;
                  *(uint *)(*pauVar20 + 8) = uVar64;
                  pauVar20 = pauVar20 + 1;
                }
                else {
                  *(ulong *)*pauVar20 = uVar27;
                  *(uint *)(*pauVar20 + 8) = uVar59;
                  pauVar20 = pauVar20 + 1;
                  uVar27 = uVar6;
                }
              }
              else {
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar27;
                auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar59));
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar6;
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar64));
                lVar13 = 0;
                for (uVar27 = uVar16; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
                {
                  lVar13 = lVar13 + 1;
                }
                uVar16 = uVar16 - 1 & uVar16;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)(uVar11 + lVar13 * 8);
                auVar32 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_25e0 + lVar13 * 4)));
                auVar43 = vpcmpgtd_avx(auVar39,auVar38);
                if (uVar16 == 0) {
                  auVar48 = vpshufd_avx(auVar43,0xaa);
                  auVar43 = vblendvps_avx(auVar39,auVar38,auVar48);
                  auVar38 = vblendvps_avx(auVar38,auVar39,auVar48);
                  auVar39 = vpcmpgtd_avx(auVar32,auVar43);
                  auVar48 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar32,auVar43,auVar48);
                  auVar43 = vblendvps_avx(auVar43,auVar32,auVar48);
                  auVar32 = vpcmpgtd_avx(auVar43,auVar38);
                  auVar48 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar43,auVar38,auVar48);
                  auVar38 = vblendvps_avx(auVar38,auVar43,auVar48);
                  *pauVar20 = auVar38;
                  pauVar20[1] = auVar32;
                  uVar27 = auVar39._0_8_;
                  pauVar20 = pauVar20 + 2;
                }
                else {
                  lVar13 = 0;
                  for (uVar27 = uVar16; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000
                      ) {
                    lVar13 = lVar13 + 1;
                  }
                  uVar16 = uVar16 - 1 & uVar16;
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = *(ulong *)(uVar11 + lVar13 * 8);
                  auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_25e0 + lVar13 * 4)));
                  if (uVar16 == 0) {
                    auVar44 = vpshufd_avx(auVar43,0xaa);
                    auVar43 = vblendvps_avx(auVar39,auVar38,auVar44);
                    auVar38 = vblendvps_avx(auVar38,auVar39,auVar44);
                    auVar39 = vpcmpgtd_avx(auVar48,auVar32);
                    auVar44 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar48,auVar32,auVar44);
                    auVar32 = vblendvps_avx(auVar32,auVar48,auVar44);
                    auVar48 = vpcmpgtd_avx(auVar32,auVar38);
                    auVar44 = vpshufd_avx(auVar48,0xaa);
                    auVar48 = vblendvps_avx(auVar32,auVar38,auVar44);
                    auVar38 = vblendvps_avx(auVar38,auVar32,auVar44);
                    auVar32 = vpcmpgtd_avx(auVar39,auVar43);
                    auVar44 = vpshufd_avx(auVar32,0xaa);
                    auVar32 = vblendvps_avx(auVar39,auVar43,auVar44);
                    auVar39 = vblendvps_avx(auVar43,auVar39,auVar44);
                    auVar43 = vpcmpgtd_avx(auVar48,auVar39);
                    auVar44 = vpshufd_avx(auVar43,0xaa);
                    auVar43 = vblendvps_avx(auVar48,auVar39,auVar44);
                    auVar39 = vblendvps_avx(auVar39,auVar48,auVar44);
                    *pauVar20 = auVar38;
                    pauVar20[1] = auVar39;
                    pauVar20[2] = auVar43;
                    uVar27 = auVar32._0_8_;
                    pauVar19 = pauVar20 + 3;
                  }
                  else {
                    *pauVar20 = auVar38;
                    pauVar20[1] = auVar39;
                    pauVar20[2] = auVar32;
                    pauVar20[3] = auVar48;
                    lVar13 = 0x30;
                    do {
                      lVar24 = lVar13;
                      lVar13 = 0;
                      for (uVar27 = uVar16; (uVar27 & 1) == 0;
                          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                        lVar13 = lVar13 + 1;
                      }
                      auVar32._8_8_ = 0;
                      auVar32._0_8_ = *(ulong *)(uVar11 + lVar13 * 8);
                      auVar38 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_25e0 + lVar13 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar20[1] + lVar24) = auVar38;
                      uVar16 = uVar16 - 1 & uVar16;
                      lVar13 = lVar24 + 0x10;
                    } while (uVar16 != 0);
                    pauVar19 = (undefined1 (*) [16])(pauVar20[1] + lVar24);
                    if (lVar24 + 0x10 != 0) {
                      lVar13 = 0x10;
                      pauVar15 = pauVar20;
                      do {
                        auVar38 = pauVar15[1];
                        uVar59 = *(uint *)(pauVar15[1] + 8);
                        pauVar15 = pauVar15 + 1;
                        lVar24 = lVar13;
                        do {
                          if (uVar59 <= *(uint *)(pauVar20[-1] + lVar24 + 8)) {
                            pauVar17 = (undefined1 (*) [16])(*pauVar20 + lVar24);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar20 + lVar24) =
                               *(undefined1 (*) [16])(pauVar20[-1] + lVar24);
                          lVar24 = lVar24 + -0x10;
                          pauVar17 = pauVar20;
                        } while (lVar24 != 0);
                        *pauVar17 = auVar38;
                        lVar13 = lVar13 + 0x10;
                      } while (pauVar19 != pauVar15);
                    }
                    uVar27 = *(ulong *)*pauVar19;
                  }
                  auVar52 = ZEXT3264(auVar51);
                  auVar55 = ZEXT3264(auVar54);
                  auVar58 = ZEXT3264(auVar57);
                  auVar63 = ZEXT3264(auVar62);
                  auVar69 = ZEXT3264(auVar68);
                  auVar72 = ZEXT3264(auVar72._0_32_);
                  pauVar20 = pauVar19;
                }
              }
            }
          }
        }
        else {
          iVar9 = 6;
        }
      } while (iVar9 == 0);
    } while (iVar9 != 6);
    lVar13 = (ulong)((uint)uVar27 & 0xf) - 8;
    if (lVar13 != 0) {
      uVar27 = uVar27 & 0xfffffffffffffff0;
      lVar24 = 0;
      do {
        lVar26 = lVar24 * 0x140;
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar28._4_4_ = uVar10;
        auVar28._0_4_ = uVar10;
        auVar28._8_4_ = uVar10;
        auVar28._12_4_ = uVar10;
        auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x90 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + lVar26));
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xa0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x10 + lVar26));
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xb0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x20 + lVar26));
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xc0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x30 + lVar26));
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xd0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x40 + lVar26));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xe0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x50 + lVar26));
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xf0 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x60 + lVar26));
        auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x100 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x70 + lVar26));
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x110 + lVar26),auVar28,
                                  *(undefined1 (*) [16])(uVar27 + 0x80 + lVar26));
        auVar39 = vsubps_avx(auVar40,auVar38);
        auVar38 = vsubps_avx(auVar50,auVar43);
        auVar43 = vsubps_avx(auVar34,auVar32);
        auVar32 = vsubps_avx(auVar48,auVar40);
        auVar48 = vsubps_avx(auVar44,auVar50);
        auVar44 = vsubps_avx(auVar28,auVar34);
        auVar29._0_4_ = auVar44._0_4_ * auVar38._0_4_;
        auVar29._4_4_ = auVar44._4_4_ * auVar38._4_4_;
        auVar29._8_4_ = auVar44._8_4_ * auVar38._8_4_;
        auVar29._12_4_ = auVar44._12_4_ * auVar38._12_4_;
        local_2550 = vfmsub231ps_fma(auVar29,auVar48,auVar43);
        auVar33._0_4_ = auVar43._0_4_ * auVar32._0_4_;
        auVar33._4_4_ = auVar43._4_4_ * auVar32._4_4_;
        auVar33._8_4_ = auVar43._8_4_ * auVar32._8_4_;
        auVar33._12_4_ = auVar43._12_4_ * auVar32._12_4_;
        local_2540 = vfmsub231ps_fma(auVar33,auVar44,auVar39);
        uVar10 = *(undefined4 *)(ray + k * 4);
        auVar73._4_4_ = uVar10;
        auVar73._0_4_ = uVar10;
        auVar73._8_4_ = uVar10;
        auVar73._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar75._4_4_ = uVar10;
        auVar75._0_4_ = uVar10;
        auVar75._8_4_ = uVar10;
        auVar75._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar78._4_4_ = uVar10;
        auVar78._0_4_ = uVar10;
        auVar78._8_4_ = uVar10;
        auVar78._12_4_ = uVar10;
        fVar42 = *(float *)(ray + k * 4 + 0x40);
        auVar67._4_4_ = fVar42;
        auVar67._0_4_ = fVar42;
        auVar67._8_4_ = fVar42;
        auVar67._12_4_ = fVar42;
        auVar40 = vsubps_avx(auVar40,auVar73);
        fVar45 = *(float *)(ray + k * 4 + 0x50);
        auVar74._4_4_ = fVar45;
        auVar74._0_4_ = fVar45;
        auVar74._8_4_ = fVar45;
        auVar74._12_4_ = fVar45;
        auVar50 = vsubps_avx(auVar50,auVar75);
        fVar46 = *(float *)(ray + k * 4 + 0x60);
        auVar76._4_4_ = fVar46;
        auVar76._0_4_ = fVar46;
        auVar76._8_4_ = fVar46;
        auVar76._12_4_ = fVar46;
        auVar34 = vsubps_avx(auVar34,auVar78);
        auVar79._0_4_ = fVar42 * auVar50._0_4_;
        auVar79._4_4_ = fVar42 * auVar50._4_4_;
        auVar79._8_4_ = fVar42 * auVar50._8_4_;
        auVar79._12_4_ = fVar42 * auVar50._12_4_;
        auVar28 = vfmsub231ps_fma(auVar79,auVar40,auVar74);
        auVar70._0_4_ = auVar44._0_4_ * auVar28._0_4_;
        auVar70._4_4_ = auVar44._4_4_ * auVar28._4_4_;
        auVar70._8_4_ = auVar44._8_4_ * auVar28._8_4_;
        auVar70._12_4_ = auVar44._12_4_ * auVar28._12_4_;
        auVar80._0_4_ = auVar43._0_4_ * auVar28._0_4_;
        auVar80._4_4_ = auVar43._4_4_ * auVar28._4_4_;
        auVar80._8_4_ = auVar43._8_4_ * auVar28._8_4_;
        auVar80._12_4_ = auVar43._12_4_ * auVar28._12_4_;
        auVar60._0_4_ = fVar46 * auVar40._0_4_;
        auVar60._4_4_ = fVar46 * auVar40._4_4_;
        auVar60._8_4_ = fVar46 * auVar40._8_4_;
        auVar60._12_4_ = fVar46 * auVar40._12_4_;
        auVar44 = vfmsub231ps_fma(auVar60,auVar34,auVar67);
        auVar43 = vfmadd231ps_fma(auVar70,auVar44,auVar48);
        auVar44 = vfmadd231ps_fma(auVar80,auVar38,auVar44);
        auVar56._0_4_ = auVar48._0_4_ * auVar39._0_4_;
        auVar56._4_4_ = auVar48._4_4_ * auVar39._4_4_;
        auVar56._8_4_ = auVar48._8_4_ * auVar39._8_4_;
        auVar56._12_4_ = auVar48._12_4_ * auVar39._12_4_;
        local_2530 = vfmsub231ps_fma(auVar56,auVar32,auVar38);
        auVar53._0_4_ = fVar45 * auVar34._0_4_;
        auVar53._4_4_ = fVar45 * auVar34._4_4_;
        auVar53._8_4_ = fVar45 * auVar34._8_4_;
        auVar53._12_4_ = fVar45 * auVar34._12_4_;
        auVar28 = vfmsub231ps_fma(auVar53,auVar50,auVar76);
        auVar77._0_4_ = local_2530._0_4_ * fVar46;
        auVar77._4_4_ = local_2530._4_4_ * fVar46;
        auVar77._8_4_ = local_2530._8_4_ * fVar46;
        auVar77._12_4_ = local_2530._12_4_ * fVar46;
        auVar38 = vfmadd231ps_fma(auVar77,local_2540,auVar74);
        auVar48 = vfmadd231ps_fma(auVar38,local_2550,auVar67);
        auVar61._8_4_ = 0x80000000;
        auVar61._0_8_ = 0x8000000080000000;
        auVar61._12_4_ = 0x80000000;
        auVar43 = vfmadd231ps_fma(auVar43,auVar28,auVar32);
        auVar38 = vandps_avx(auVar48,auVar61);
        uVar59 = auVar38._0_4_;
        local_25e0._0_4_ = (float)(uVar59 ^ auVar43._0_4_);
        uVar64 = auVar38._4_4_;
        local_25e0._4_4_ = (float)(uVar64 ^ auVar43._4_4_);
        uVar65 = auVar38._8_4_;
        local_25e0._8_4_ = (float)(uVar65 ^ auVar43._8_4_);
        uVar66 = auVar38._12_4_;
        local_25e0._12_4_ = (float)(uVar66 ^ auVar43._12_4_);
        auVar38 = vfmadd231ps_fma(auVar44,auVar39,auVar28);
        local_25e0._16_4_ = (float)(uVar59 ^ auVar38._0_4_);
        local_25e0._20_4_ = (float)(uVar64 ^ auVar38._4_4_);
        local_25e0._24_4_ = (float)(uVar65 ^ auVar38._8_4_);
        local_25e0._28_4_ = (float)(uVar66 ^ auVar38._12_4_);
        auVar43 = ZEXT816(0) << 0x20;
        auVar38 = vcmpps_avx(local_25e0._0_16_,auVar43,5);
        auVar39 = vcmpps_avx(local_25e0._16_16_,auVar43,5);
        auVar38 = vandps_avx(auVar39,auVar38);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        local_25b0 = vandps_avx(auVar48,auVar44);
        auVar39 = vcmpps_avx(auVar48,auVar43,4);
        auVar38 = vandps_avx(auVar38,auVar39);
        auVar71._0_4_ = local_25e0._0_4_ + local_25e0._16_4_;
        auVar71._4_4_ = local_25e0._4_4_ + local_25e0._20_4_;
        auVar71._8_4_ = local_25e0._8_4_ + local_25e0._24_4_;
        auVar71._12_4_ = local_25e0._12_4_ + local_25e0._28_4_;
        auVar39 = vcmpps_avx(auVar71,local_25b0,2);
        auVar43 = auVar39 & auVar38;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          auVar38 = vandps_avx(auVar38,auVar39);
          auVar49._0_4_ = local_2530._0_4_ * auVar34._0_4_;
          auVar49._4_4_ = local_2530._4_4_ * auVar34._4_4_;
          auVar49._8_4_ = local_2530._8_4_ * auVar34._8_4_;
          auVar49._12_4_ = local_2530._12_4_ * auVar34._12_4_;
          auVar39 = vfmadd213ps_fma(auVar50,local_2540,auVar49);
          auVar39 = vfmadd213ps_fma(auVar40,local_2550,auVar39);
          local_25c0._0_4_ = (float)(uVar59 ^ auVar39._0_4_);
          local_25c0._4_4_ = (float)(uVar64 ^ auVar39._4_4_);
          local_25c0._8_4_ = (float)(uVar65 ^ auVar39._8_4_);
          local_25c0._12_4_ = (float)(uVar66 ^ auVar39._12_4_);
          fVar42 = *(float *)(ray + k * 4 + 0x30);
          auVar40._0_4_ = local_25b0._0_4_ * fVar42;
          auVar40._4_4_ = local_25b0._4_4_ * fVar42;
          auVar40._8_4_ = local_25b0._8_4_ * fVar42;
          auVar40._12_4_ = local_25b0._12_4_ * fVar42;
          auVar39 = vcmpps_avx(auVar40,local_25c0,1);
          fVar42 = *(float *)(ray + k * 4 + 0x80);
          auVar50._0_4_ = local_25b0._0_4_ * fVar42;
          auVar50._4_4_ = local_25b0._4_4_ * fVar42;
          auVar50._8_4_ = local_25b0._8_4_ * fVar42;
          auVar50._12_4_ = local_25b0._12_4_ * fVar42;
          auVar43 = vcmpps_avx(local_25c0,auVar50,2);
          auVar39 = vandps_avx(auVar39,auVar43);
          auVar43 = auVar38 & auVar39;
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            local_2680 = vandps_avx(auVar38,auVar39);
            local_2590 = local_2680;
            local_2628 = context->scene;
            auVar38 = vrcpps_avx(local_25b0);
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = &DAT_3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar39 = vfnmadd213ps_fma(local_25b0,auVar38,auVar34);
            auVar38 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
            fVar42 = auVar38._0_4_;
            local_2560._0_4_ = fVar42 * local_25c0._0_4_;
            fVar45 = auVar38._4_4_;
            local_2560._4_4_ = fVar45 * local_25c0._4_4_;
            fVar46 = auVar38._8_4_;
            local_2560._8_4_ = fVar46 * local_25c0._8_4_;
            fVar47 = auVar38._12_4_;
            local_2560._12_4_ = fVar47 * local_25c0._12_4_;
            auVar31 = ZEXT1664(local_2560);
            local_2580[0] = fVar42 * local_25e0._0_4_;
            local_2580[1] = fVar45 * local_25e0._4_4_;
            local_2580[2] = fVar46 * local_25e0._8_4_;
            local_2580[3] = fVar47 * local_25e0._12_4_;
            auVar35._8_4_ = 0x7f800000;
            auVar35._0_8_ = 0x7f8000007f800000;
            auVar35._12_4_ = 0x7f800000;
            auVar38 = vblendvps_avx(auVar35,local_2560,local_2680);
            local_2570[0] = fVar42 * local_25e0._16_4_;
            local_2570[1] = fVar45 * local_25e0._20_4_;
            local_2570[2] = fVar46 * local_25e0._24_4_;
            local_2570[3] = fVar47 * local_25e0._28_4_;
            auVar39 = vshufps_avx(auVar38,auVar38,0xb1);
            auVar39 = vminps_avx(auVar39,auVar38);
            auVar43 = vshufpd_avx(auVar39,auVar39,1);
            auVar39 = vminps_avx(auVar43,auVar39);
            auVar38 = vcmpps_avx(auVar38,auVar39,0);
            auVar43 = local_2680 & auVar38;
            auVar39 = vpcmpeqd_avx(auVar39,auVar39);
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar39 = auVar38;
            }
            lVar26 = lVar26 + uVar27;
            auVar38 = vandps_avx(local_2680,auVar39);
            uVar10 = vmovmskps_avx(auVar38);
            pGVar21 = (Geometry *)0x0;
            for (uVar11 = CONCAT44((int)((ulong)context >> 0x20),uVar10); (uVar11 & 1) == 0;
                uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              pGVar21 = (Geometry *)((long)&(pGVar21->super_RefCount)._vptr_RefCount + 1);
            }
            do {
              uVar59 = *(uint *)(lVar26 + 0x120 + (long)pGVar21 * 4);
              pGVar12 = (local_2628->geometries).items[uVar59].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2680 + (long)pGVar21 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar42 = local_2580[(long)pGVar21];
                  fVar45 = local_2570[(long)pGVar21];
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_2560 + (long)pGVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)(local_2550 + (long)pGVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)(local_2540 + (long)pGVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)(local_2530 + (long)pGVar21 * 4);
                  *(float *)(ray + k * 4 + 0xf0) = fVar42;
                  *(float *)(ray + k * 4 + 0x100) = fVar45;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar26 + 0x130 + (long)pGVar21 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar59;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                local_2520 = auVar31._0_16_;
                local_2480 = auVar81._0_32_;
                fVar42 = local_2580[(long)pGVar21];
                local_24e0._4_4_ = fVar42;
                local_24e0._0_4_ = fVar42;
                local_24e0._8_4_ = fVar42;
                local_24e0._12_4_ = fVar42;
                local_24d0 = local_2570[(long)pGVar21];
                local_24b0._4_4_ = uVar59;
                local_24b0._0_4_ = uVar59;
                local_24b0._8_4_ = uVar59;
                local_24b0._12_4_ = uVar59;
                local_24c0 = *(undefined4 *)(lVar26 + 0x130 + (long)pGVar21 * 4);
                uVar10 = *(undefined4 *)(local_2550 + (long)pGVar21 * 4);
                uVar1 = *(undefined4 *)(local_2540 + (long)pGVar21 * 4);
                local_2500._4_4_ = uVar1;
                local_2500._0_4_ = uVar1;
                local_2500._8_4_ = uVar1;
                local_2500._12_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_2530 + (long)pGVar21 * 4);
                local_24f0._4_4_ = uVar1;
                local_24f0._0_4_ = uVar1;
                local_24f0._8_4_ = uVar1;
                local_24f0._12_4_ = uVar1;
                local_2510[0] = (RTCHitN)(char)uVar10;
                local_2510[1] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_2510[2] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_2510[3] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_2510[4] = (RTCHitN)(char)uVar10;
                local_2510[5] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_2510[6] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_2510[7] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_2510[8] = (RTCHitN)(char)uVar10;
                local_2510[9] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_2510[10] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_2510[0xb] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_2510[0xc] = (RTCHitN)(char)uVar10;
                local_2510[0xd] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_2510[0xe] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_2510[0xf] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                fStack_24cc = local_24d0;
                fStack_24c8 = local_24d0;
                fStack_24c4 = local_24d0;
                uStack_24bc = local_24c0;
                uStack_24b8 = local_24c0;
                uStack_24b4 = local_24c0;
                vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                uStack_249c = context->user->instID[0];
                local_24a0 = uStack_249c;
                uStack_2498 = uStack_249c;
                uStack_2494 = uStack_249c;
                uStack_2490 = context->user->instPrimID[0];
                uStack_248c = uStack_2490;
                uStack_2488 = uStack_2490;
                uStack_2484 = uStack_2490;
                uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)(local_2560 + (long)pGVar21 * 4);
                local_2670 = *local_2620;
                uStack_2668 = local_2620[1];
                local_2610.valid = (int *)&local_2670;
                local_2610.geometryUserPtr = pGVar12->userPtr;
                local_2610.context = context->user;
                local_2610.hit = local_2510;
                local_2610.N = 4;
                local_2658 = lVar13;
                local_2650 = This;
                local_2648 = uVar18;
                local_2640 = uVar14;
                local_2638 = uVar22;
                local_2630 = pauVar20;
                local_2610.ray = (RTCRayN *)ray;
                if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->intersectionFilterN)(&local_2610);
                }
                auVar7._8_8_ = uStack_2668;
                auVar7._0_8_ = local_2670;
                if (auVar7 == (undefined1  [16])0x0) {
                  auVar38 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar38 = auVar38 ^ _DAT_01febe20;
                }
                else {
                  p_Var2 = context->args->filter;
                  if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var2)(&local_2610);
                  }
                  auVar8._8_8_ = uStack_2668;
                  auVar8._0_8_ = local_2670;
                  auVar39 = vpcmpeqd_avx(auVar8,_DAT_01feba10);
                  auVar38 = auVar39 ^ _DAT_01febe20;
                  if (auVar8 != (undefined1  [16])0x0) {
                    auVar39 = auVar39 ^ _DAT_01febe20;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])local_2610.hit);
                    *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                    *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                    *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                    *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                    *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                    *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                    *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                    *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar43;
                    auVar39 = vmaskmovps_avx(auVar39,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                    *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar39;
                  }
                }
                auVar37._8_8_ = 0x100000001;
                auVar37._0_8_ = 0x100000001;
                if ((auVar37 & auVar38) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar10;
                }
                *(undefined4 *)(local_2680 + (long)pGVar21 * 4) = 0;
                uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar30._4_4_ = uVar10;
                auVar30._0_4_ = uVar10;
                auVar30._8_4_ = uVar10;
                auVar30._12_4_ = uVar10;
                auVar31 = ZEXT1664(local_2520);
                auVar38 = vcmpps_avx(local_2520,auVar30,2);
                local_2680 = vandps_avx(auVar38,local_2680);
                auVar81 = ZEXT3264(local_2480);
                pGVar12 = pGVar21;
                lVar13 = local_2658;
                uVar14 = local_2640;
                This = local_2650;
                uVar18 = local_2648;
                pauVar20 = local_2630;
                uVar22 = local_2638;
              }
              if ((((local_2680 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2680 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2680 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2680[0xf]) break;
              auVar36._8_4_ = 0x7f800000;
              auVar36._0_8_ = 0x7f8000007f800000;
              auVar36._12_4_ = 0x7f800000;
              auVar38 = vblendvps_avx(auVar36,auVar31._0_16_,local_2680);
              auVar39 = vshufps_avx(auVar38,auVar38,0xb1);
              auVar39 = vminps_avx(auVar39,auVar38);
              auVar43 = vshufpd_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar43,auVar39);
              auVar39 = vcmpps_avx(auVar38,auVar39,0);
              auVar43 = local_2680 & auVar39;
              auVar38 = local_2680;
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar43[0xf] < '\0') {
                auVar38 = vandps_avx(auVar39,local_2680);
              }
              uVar10 = vmovmskps_avx(auVar38);
              pGVar21 = (Geometry *)0x0;
              for (uVar11 = CONCAT44((int)((ulong)pGVar12 >> 0x20),uVar10); (uVar11 & 1) == 0;
                  uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                pGVar21 = (Geometry *)((long)&(pGVar21->super_RefCount)._vptr_RefCount + 1);
              }
            } while( true );
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != lVar13);
    }
    uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar31 = ZEXT3264(CONCAT428(uVar10,CONCAT424(uVar10,CONCAT420(uVar10,CONCAT416(uVar10,CONCAT412
                                                  (uVar10,CONCAT48(uVar10,CONCAT44(uVar10,uVar10))))
                                                  ))));
    auVar52 = ZEXT3264(local_23c0);
    auVar55 = ZEXT3264(local_23e0);
    auVar58 = ZEXT3264(local_2400);
    auVar63 = ZEXT3264(local_2420);
    auVar69 = ZEXT3264(local_2440);
    auVar72 = ZEXT3264(local_2460);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }